

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall Builder::~Builder(Builder *this)

{
  Builder *this_local;
  
  Cleanup(this);
  std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::~unique_ptr
            (&this->command_runner_);
  Plan::~Plan(&this->plan_);
  return;
}

Assistant:

Builder::~Builder() {
  Cleanup();
}